

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf_mem_image.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::debugging_internal::ElfMemImage::Init(ElfMemImage *this,void *base)

{
  Elf64_Sym *pEVar1;
  uint uVar2;
  Elf64_Addr EVar3;
  long lVar4;
  size_t sVar5;
  Elf64_Ehdr *pEVar6;
  Elf64_Phdr *pEVar7;
  Elf64_Sym *pEVar8;
  Elf64_Sym *pEVar9;
  uint uVar10;
  Elf64_Sym *pEVar11;
  ulong uVar12;
  long *plVar13;
  int iVar14;
  Elf64_Phdr *pEVar15;
  Elf64_Phdr *pEVar16;
  int i;
  uint uVar17;
  undefined1 auVar18 [16];
  
  *(undefined8 *)((long)&this->verdef_ + 4) = 0;
  *(undefined8 *)((long)&this->dynstr_ + 4) = 0;
  this->versym_ = (Elf64_Versym *)0x0;
  this->verdef_ = (Elf64_Verdef *)0x0;
  this->ehdr_ = (Elf64_Ehdr *)0x0;
  this->dynsym_ = (Elf64_Sym *)0x0;
  this->strsize_ = 0;
  this->verdefnum_ = 0;
  this->link_base_ = 0xffffffffffffffff;
  if (base != (void *)0x0) {
    if ((((*base != '\x7f') || (*(char *)((long)base + 1) != 'E')) ||
        (*(char *)((long)base + 2) != 'L')) || (*(char *)((long)base + 3) != 'F')) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/debugging/internal/elf_mem_image.cc"
                    ,0xa5,"void absl::debugging_internal::ElfMemImage::Init(const void *)");
    }
    if (*(char *)((long)base + 4) != '\x02') {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/debugging/internal/elf_mem_image.cc"
                    ,0xaa,"void absl::debugging_internal::ElfMemImage::Init(const void *)");
    }
    if (*(char *)((long)base + 5) != '\x01') {
      if (*(char *)((long)base + 5) != '\x02') {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/debugging/internal/elf_mem_image.cc"
                      ,0xbd,"void absl::debugging_internal::ElfMemImage::Init(const void *)");
      }
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/debugging/internal/elf_mem_image.cc"
                    ,0xb7,"void absl::debugging_internal::ElfMemImage::Init(const void *)");
    }
    this->ehdr_ = (Elf64_Ehdr *)base;
    pEVar6 = (Elf64_Ehdr *)base;
    pEVar15 = (Elf64_Phdr *)0x0;
    for (uVar17 = 0; uVar17 < pEVar6->e_phnum; uVar17 = uVar17 + 1) {
      pEVar7 = GetPhdr(this,uVar17);
      pEVar16 = pEVar7;
      if (((pEVar7->p_type != 2) && (pEVar16 = pEVar15, pEVar7->p_type == 1)) &&
         (this->link_base_ == 0xffffffffffffffff)) {
        this->link_base_ = pEVar7->p_vaddr;
      }
      pEVar6 = this->ehdr_;
      pEVar15 = pEVar16;
    }
    EVar3 = this->link_base_;
    if ((EVar3 == 0xffffffffffffffff) || (pEVar15 == (Elf64_Phdr *)0x0)) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/debugging/internal/elf_mem_image.cc"
                    ,0xd2,"void absl::debugging_internal::ElfMemImage::Init(const void *)");
    }
    pEVar11 = (Elf64_Sym *)0x0;
    pEVar8 = (Elf64_Sym *)0x0;
    for (plVar13 = (long *)((long)base + (pEVar15->p_vaddr - EVar3)); lVar4 = *plVar13, lVar4 != 0;
        plVar13 = plVar13 + 2) {
      sVar5 = plVar13[1];
      pEVar1 = (Elf64_Sym *)((long)base + (sVar5 - EVar3));
      pEVar9 = pEVar8;
      switch(lVar4) {
      case 4:
        pEVar11 = pEVar1;
        break;
      case 5:
        this->dynstr_ = (char *)pEVar1;
        break;
      case 6:
        this->dynsym_ = pEVar1;
        break;
      case 7:
      case 8:
      case 9:
        break;
      case 10:
        this->strsize_ = sVar5;
        break;
      default:
        pEVar9 = pEVar1;
        if (lVar4 != 0x6ffffef5) {
          if (lVar4 == 0x6ffffff0) {
            this->versym_ = (Elf64_Versym *)pEVar1;
            pEVar9 = pEVar8;
          }
          else if (lVar4 == 0x6ffffffc) {
            this->verdef_ = (Elf64_Verdef *)pEVar1;
            pEVar9 = pEVar8;
          }
          else {
            pEVar9 = pEVar8;
            if (lVar4 == 0x6ffffffd) {
              this->verdefnum_ = sVar5;
            }
          }
        }
      }
      pEVar8 = pEVar9;
    }
    auVar18._0_4_ = -(uint)(*(int *)((long)&this->dynsym_ + 4) == 0 && *(int *)&this->dynsym_ == 0);
    auVar18._4_4_ = -(uint)(*(int *)&this->versym_ == 0 && *(int *)((long)&this->versym_ + 4) == 0);
    auVar18._8_4_ = -(uint)(*(int *)((long)&this->verdef_ + 4) == 0 && *(int *)&this->verdef_ == 0);
    auVar18._12_4_ = -(uint)(*(int *)&this->dynstr_ == 0 && *(int *)((long)&this->dynstr_ + 4) == 0)
    ;
    iVar14 = movmskps(0x64d114,auVar18);
    if ((((iVar14 != 0) || (this->verdefnum_ == 0)) ||
        (pEVar11 == (Elf64_Sym *)0x0 && pEVar8 == (Elf64_Sym *)0x0)) || (this->strsize_ == 0)) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/debugging/internal/elf_mem_image.cc"
                    ,0x100,"void absl::debugging_internal::ElfMemImage::Init(const void *)");
    }
    if (pEVar11 == (Elf64_Sym *)0x0) {
      if (pEVar8 == (Elf64_Sym *)0x0) {
        __assert_fail("gnu_hash",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/debugging/internal/elf_mem_image.cc"
                      ,0x108,"void absl::debugging_internal::ElfMemImage::Init(const void *)");
      }
      uVar17 = (uint)pEVar8->st_value;
      uVar12 = (ulong)pEVar8->st_name;
      do {
        if (uVar12 == 0) {
          uVar10 = 0;
          goto LAB_003ee2d7;
        }
        uVar10 = *(uint *)((long)&pEVar8->st_value + uVar12 * 4 + (ulong)uVar17 * 8 + 4);
        uVar12 = uVar12 - 1;
      } while (uVar10 == 0);
      uVar2._0_1_ = pEVar8->st_info;
      uVar2._1_1_ = pEVar8->st_other;
      uVar2._2_2_ = pEVar8->st_shndx;
      do {
        uVar12 = (ulong)uVar10;
        uVar10 = uVar10 + 1;
      } while ((*(byte *)((long)pEVar8 +
                         uVar12 * 4 +
                         (ulong)uVar2 * -4 + (ulong)pEVar8->st_name * 4 + (ulong)uVar17 * 8 + 0x10)
               & 1) == 0);
    }
    else {
      uVar10._0_1_ = pEVar11->st_info;
      uVar10._1_1_ = pEVar11->st_other;
      uVar10._2_2_ = pEVar11->st_shndx;
    }
LAB_003ee2d7:
    this->num_syms_ = uVar10;
  }
  return;
}

Assistant:

void ElfMemImage::Init(const void *base) {
  ehdr_      = nullptr;
  dynsym_    = nullptr;
  dynstr_    = nullptr;
  versym_    = nullptr;
  verdef_    = nullptr;
  num_syms_ = 0;
  strsize_   = 0;
  verdefnum_ = 0;
  // Sentinel: PT_LOAD .p_vaddr can't possibly be this.
  link_base_ = ~ElfW(Addr){0};  // NOLINT(readability/braces)
  if (!base) {
    return;
  }
  const char *const base_as_char = reinterpret_cast<const char *>(base);
  if (base_as_char[EI_MAG0] != ELFMAG0 || base_as_char[EI_MAG1] != ELFMAG1 ||
      base_as_char[EI_MAG2] != ELFMAG2 || base_as_char[EI_MAG3] != ELFMAG3) {
    assert(false);
    return;
  }
  int elf_class = base_as_char[EI_CLASS];
  if (elf_class != kElfClass) {
    assert(false);
    return;
  }
  switch (base_as_char[EI_DATA]) {
    case ELFDATA2LSB: {
#ifndef ABSL_IS_LITTLE_ENDIAN
      assert(false);
      return;
#endif
      break;
    }
    case ELFDATA2MSB: {
#ifndef ABSL_IS_BIG_ENDIAN
      assert(false);
      return;
#endif
      break;
    }
    default: {
      assert(false);
      return;
    }
  }

  ehdr_ = reinterpret_cast<const ElfW(Ehdr) *>(base);
  const ElfW(Phdr) *dynamic_program_header = nullptr;
  for (int i = 0; i < ehdr_->e_phnum; ++i) {
    const ElfW(Phdr) *const program_header = GetPhdr(i);
    switch (program_header->p_type) {
      case PT_LOAD:
        if (!~link_base_) {
          link_base_ = program_header->p_vaddr;
        }
        break;
      case PT_DYNAMIC:
        dynamic_program_header = program_header;
        break;
    }
  }
  if (!~link_base_ || !dynamic_program_header) {
    assert(false);
    // Mark this image as not present. Can not recur infinitely.
    Init(nullptr);
    return;
  }
  ptrdiff_t relocation =
      base_as_char - reinterpret_cast<const char *>(link_base_);
  ElfW(Dyn)* dynamic_entry = reinterpret_cast<ElfW(Dyn)*>(
      static_cast<intptr_t>(dynamic_program_header->p_vaddr) + relocation);
  uint32_t *sysv_hash = nullptr;
  uint32_t *gnu_hash = nullptr;
  for (; dynamic_entry->d_tag != DT_NULL; ++dynamic_entry) {
    const auto value =
        static_cast<intptr_t>(dynamic_entry->d_un.d_val) + relocation;
    switch (dynamic_entry->d_tag) {
      case DT_HASH:
        sysv_hash = reinterpret_cast<uint32_t *>(value);
        break;
      case DT_GNU_HASH:
        gnu_hash = reinterpret_cast<uint32_t *>(value);
        break;
      case DT_SYMTAB:
        dynsym_ = reinterpret_cast<ElfW(Sym) *>(value);
        break;
      case DT_STRTAB:
        dynstr_ = reinterpret_cast<const char *>(value);
        break;
      case DT_VERSYM:
        versym_ = reinterpret_cast<ElfW(Versym) *>(value);
        break;
      case DT_VERDEF:
        verdef_ = reinterpret_cast<ElfW(Verdef) *>(value);
        break;
      case DT_VERDEFNUM:
        verdefnum_ = static_cast<size_t>(dynamic_entry->d_un.d_val);
        break;
      case DT_STRSZ:
        strsize_ = static_cast<size_t>(dynamic_entry->d_un.d_val);
        break;
      default:
        // Unrecognized entries explicitly ignored.
        break;
    }
  }
  if ((!sysv_hash && !gnu_hash) || !dynsym_ || !dynstr_ || !versym_ ||
      !verdef_ || !verdefnum_ || !strsize_) {
    assert(false);  // invalid VDSO
    // Mark this image as not present. Can not recur infinitely.
    Init(nullptr);
    return;
  }
  if (sysv_hash) {
    num_syms_ = sysv_hash[1];
  } else {
    assert(gnu_hash);
    // Compute the number of symbols for DT_GNU_HASH, which is specified by
    // https://sourceware.org/gnu-gabi/program-loading-and-dynamic-linking.txt
    uint32_t nbuckets = gnu_hash[0];
    // The buckets array is located after the header (4 uint32) and the bloom
    // filter (size_t array of gnu_hash[2] elements).
    uint32_t *buckets = gnu_hash + 4 + sizeof(size_t) / 4 * gnu_hash[2];
    // Find the chain of the last non-empty bucket.
    uint32_t idx = 0;
    for (uint32_t i = nbuckets; i > 0;) {
      idx = buckets[--i];
      if (idx != 0) break;
    }
    if (idx != 0) {
      // Find the last element of the chain, which has an odd value.
      // Add one to get the number of symbols.
      uint32_t *chain = buckets + nbuckets - gnu_hash[1];
      while (chain[idx++] % 2 == 0) {
      }
    }
    num_syms_ = idx;
  }
}